

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool NeedReparseTagDecls(TidyDocImpl *doc,TidyOptionValue *current,TidyOptionValue *new,
                        uint *changedUserTags)

{
  TidyOptionId TVar1;
  Bool BVar2;
  TidyOptionImpl *local_38;
  TidyOptionImpl *option;
  uint ixVal;
  Bool ret;
  uint *changedUserTags_local;
  TidyOptionValue *new_local;
  TidyOptionValue *current_local;
  TidyDocImpl *doc_local;
  
  option._4_4_ = no;
  local_38 = option_defs;
  *changedUserTags = 0;
  option._0_4_ = TidyUnknownOption;
  while( true ) {
    if (TidyXmlTags < (TidyOptionId)option) {
      return option._4_4_;
    }
    if ((TidyOptionId)option != local_38->id) break;
    TVar1 = local_38->id;
    if (TVar1 == TidyBlockTags) {
      BVar2 = OptionValueIdentical
                        (local_38,current + (TidyOptionId)option,new + (TidyOptionId)option);
      if (BVar2 == no) {
        *changedUserTags = *changedUserTags | 4;
        option._4_4_ = yes;
      }
    }
    else if (TVar1 == TidyEmptyTags) {
      BVar2 = OptionValueIdentical
                        (local_38,current + (TidyOptionId)option,new + (TidyOptionId)option);
      if (BVar2 == no) {
        *changedUserTags = *changedUserTags | 1;
        option._4_4_ = yes;
      }
    }
    else if (TVar1 == TidyInlineTags) {
      BVar2 = OptionValueIdentical
                        (local_38,current + (TidyOptionId)option,new + (TidyOptionId)option);
      if (BVar2 == no) {
        *changedUserTags = *changedUserTags | 2;
        option._4_4_ = yes;
      }
    }
    else if ((TVar1 == TidyPreTags) &&
            (BVar2 = OptionValueIdentical
                               (local_38,current + (TidyOptionId)option,new + (TidyOptionId)option),
            BVar2 == no)) {
      *changedUserTags = *changedUserTags | 8;
      option._4_4_ = yes;
    }
    local_38 = local_38 + 1;
    option._0_4_ = (TidyOptionId)option + TidyAccessibilityCheckLevel;
  }
  __assert_fail("ixVal == (uint) option->id",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                ,0x243,
                "Bool NeedReparseTagDecls(TidyDocImpl *, const TidyOptionValue *, const TidyOptionValue *, uint *)"
               );
}

Assistant:

static Bool NeedReparseTagDecls( TidyDocImpl* doc,
                                 const TidyOptionValue* current,
                                 const TidyOptionValue* new,
                                 uint *changedUserTags )
{
    Bool ret = no;
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    *changedUserTags = tagtype_null;

    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        switch (option->id)
        {
#define TEST_USERTAGS(USERTAGOPTION,USERTAGTYPE) \
        case USERTAGOPTION: \
            if (!OptionValueIdentical(option,&current[ixVal],&new[ixVal])) \
            { \
                *changedUserTags |= USERTAGTYPE; \
                ret = yes; \
            } \
            break
            TEST_USERTAGS(TidyInlineTags,tagtype_inline);
            TEST_USERTAGS(TidyBlockTags,tagtype_block);
            TEST_USERTAGS(TidyEmptyTags,tagtype_empty);
            TEST_USERTAGS(TidyPreTags,tagtype_pre);
        default:
            break;
        }
    }
    return ret;
}